

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void TestHugeAllocations(AllocatorState *rnd)

{
  int iVar1;
  TestingPortal *pTVar2;
  ulong uVar3;
  void *pvVar4;
  long *plVar5;
  MallocExtension *inst;
  void *p;
  size_t i_1;
  size_t i;
  AllocatorState *rnd_local;
  
  for (i_1 = 0; i_1 < 70000; i_1 = (long)iVar1 + i_1) {
    TryHugeAllocation(-i_1 - 1,rnd);
    iVar1 = TestHarness::Uniform(&rnd->super_TestHarness,0x14);
  }
  pTVar2 = tcmalloc::TestingPortal::Get();
  uVar3 = (**(code **)(*(long *)pTVar2 + 8))();
  if ((uVar3 & 1) == 0) {
    for (p = (void *)0x0; p < (void *)0x64; p = (void *)((long)p + 1)) {
      pvVar4 = AllocatorState::alloc(rnd,(long)p + 0x7fffffffffffffff);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
      }
      pvVar4 = AllocatorState::alloc(rnd,0x7fffffffffffffff - (long)p);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
      }
    }
  }
  plVar5 = (long *)MallocExtension::instance();
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x90))();
    return;
  }
  syscall(1,2,"Check failed: inst\n",0x13);
  abort();
}

Assistant:

static void TestHugeAllocations(AllocatorState* rnd) {
  // Check that asking for stuff tiny bit smaller than largest possible
  // size returns nullptr.
  for (size_t i = 0; i < 70000; i += rnd->Uniform(20)) {
    TryHugeAllocation(kMaxSize - i, rnd);
  }
  // Asking for memory sizes near signed/unsigned boundary (kMaxSignedSize)
  // might work or not, depending on the amount of virtual memory.
  if (!TestingPortal::Get()->IsDebuggingMalloc()) {
   // debug allocation takes forever for huge allocs
    for (size_t i = 0; i < 100; i++) {
      void* p = nullptr;
      p = rnd->alloc(kMaxSignedSize + i);
      if (p) free(p);    // if: free(nullptr) is not necessarily defined
      p = rnd->alloc(kMaxSignedSize - i);
      if (p) free(p);
    }
  }

  // Check that ReleaseFreeMemory has no visible effect (aka, does not
  // crash the test):
  MallocExtension* inst = MallocExtension::instance();
  CHECK(inst);
  inst->ReleaseFreeMemory();
}